

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

Instr * LowererMD::InsertConvertFloat64ToInt32
                  (RoundMode roundMode,Opnd *dst,Opnd *src,Instr *insertBeforeInstr)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *opnd;
  intptr_t pMemLoc;
  MemRefOpnd *src2;
  Instr *instr;
  undefined1 local_48 [8];
  AutoReuseOpnd autoReuseSrcPlusHalf;
  
  if (dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1ca9,"(dst)","dst");
    if (!bVar2) goto LAB_00660ae1;
    *puVar3 = 0;
  }
  if (dst->m_type != TyInt32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1caa,"(dst->IsInt32())","dst->IsInt32()");
    if (!bVar2) goto LAB_00660ae1;
    *puVar3 = 0;
  }
  if (src == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1cab,"(src)","src");
    if (!bVar2) goto LAB_00660ae1;
    *puVar3 = 0;
  }
  if (src->m_type != TyFloat64) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1cac,"(src->IsFloat64())","src->IsFloat64()");
    if (!bVar2) goto LAB_00660ae1;
    *puVar3 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1cad,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) goto LAB_00660ae1;
    *puVar3 = 0;
  }
  func = insertBeforeInstr->m_func;
  local_48 = (undefined1  [8])0x0;
  autoReuseSrcPlusHalf.func._1_1_ = 1;
  if (roundMode == RoundModeHalfToEven) {
    instr = IR::Instr::New(CVTSD2SI,dst,src,func);
    IR::Instr::InsertBefore(insertBeforeInstr,instr);
    Legalize<false>(instr,false);
  }
  else if (roundMode == RoundModeTowardInteger) {
    opnd = IR::RegOpnd::New(TyFloat64,func);
    IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_48,&opnd->super_Opnd,func,true);
    pMemLoc = ThreadContextInfo::GetDoublePointFiveAddr(func->m_threadContextInfo);
    src2 = IR::MemRefOpnd::New(pMemLoc,TyFloat64,func,AddrOpndKindDynamicDoubleRef);
    Lowerer::InsertAdd(false,&opnd->super_Opnd,src,&src2->super_Opnd,insertBeforeInstr);
    instr = IR::Instr::New(CVTTSD2SI,dst,&opnd->super_Opnd,func);
    IR::Instr::InsertBefore(insertBeforeInstr,instr);
    Legalize<false>(instr,false);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1cd3,"(0)","RoundMode not supported.");
    if (!bVar2) {
LAB_00660ae1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    instr = (Instr *)0x0;
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_48);
  return instr;
}

Assistant:

IR::Instr *
LowererMD::InsertConvertFloat64ToInt32(const RoundMode roundMode, IR::Opnd *const dst, IR::Opnd *const src, IR::Instr *const insertBeforeInstr)
{
    Assert(dst);
    Assert(dst->IsInt32());
    Assert(src);
    Assert(src->IsFloat64());
    Assert(insertBeforeInstr);

    // The caller is expected to check for overflow. To have that work be done automatically, use LowererMD::EmitFloatToInt.

    Func *const func = insertBeforeInstr->m_func;
    IR::AutoReuseOpnd autoReuseSrcPlusHalf;
    IR::Instr *instr = nullptr;

    switch (roundMode)
    {
        case RoundModeTowardInteger:
        {
            // Conversion with rounding towards nearest integer is not supported by the architecture. Add 0.5 and do a
            // round-toward-zero conversion instead.
            IR::RegOpnd *const srcPlusHalf = IR::RegOpnd::New(TyFloat64, func);
            autoReuseSrcPlusHalf.Initialize(srcPlusHalf, func);
            Lowerer::InsertAdd(
                false /* needFlags */,
                srcPlusHalf,
                src,
                IR::MemRefOpnd::New(func->GetThreadContextInfo()->GetDoublePointFiveAddr(), TyFloat64, func,
                    IR::AddrOpndKindDynamicDoubleRef),
                insertBeforeInstr);

            instr = IR::Instr::New(LowererMD::MDConvertFloat64ToInt32Opcode(RoundModeTowardZero), dst, srcPlusHalf, func);

            insertBeforeInstr->InsertBefore(instr);
            LowererMD::Legalize(instr);
            return instr;
        }
        case RoundModeHalfToEven:
        {
            instr = IR::Instr::New(LowererMD::MDConvertFloat64ToInt32Opcode(RoundModeHalfToEven), dst, src, func);
            insertBeforeInstr->InsertBefore(instr);
            LowererMD::Legalize(instr);
            return instr;
        }
        default:
            AssertMsg(0, "RoundMode not supported.");
            return nullptr;
    }
}